

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O0

bool __thiscall
cppnet::ThreadSafeQueue<cppnet::Log_*>::Pop(ThreadSafeQueue<cppnet::Log_*> *this,Log **value)

{
  bool bVar1;
  reference ppLVar2;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  Log **value_local;
  ThreadSafeQueue<cppnet::Log_*> *this_local;
  
  lock._8_8_ = value;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->_mutex);
  bVar1 = std::queue<cppnet::Log_*,_std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>_>::
          empty(&this->_queue);
  if (!bVar1) {
    ppLVar2 = std::queue<cppnet::Log_*,_std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>_>
              ::front(&this->_queue);
    *(value_type *)lock._8_8_ = *ppLVar2;
    std::queue<cppnet::Log_*,_std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>_>::pop
              (&this->_queue);
  }
  this_local._7_1_ = !bVar1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Pop(T& value) {
        std::unique_lock<std::mutex> lock(_mutex);
        if (_queue.empty()) {
            return false;
        }
        value = std::move(_queue.front());
        _queue.pop();
        return true;
    }